

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O2

shared_ptr<ccs::SearchState> __thiscall
ccs::SearchState::newChild(SearchState *this,shared_ptr<const_ccs::SearchState> *parent,Key *key)

{
  bool bVar1;
  SearchState *pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  byte bVar4;
  shared_ptr<const_ccs::SearchState> *psVar5;
  shared_ptr<ccs::SearchState> sVar6;
  
  pSVar2 = (SearchState *)operator_new(0xf8);
  SearchState(pSVar2,parent,key);
  std::__shared_ptr<ccs::SearchState,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ccs::SearchState,void>
            ((__shared_ptr<ccs::SearchState,(__gnu_cxx::_Lock_policy)2> *)this,pSVar2);
  bVar4 = 0;
  _Var3._M_pi = extraout_RDX;
  psVar5 = parent;
  do {
    while (pSVar2 = (psVar5->super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr, pSVar2 != (SearchState *)0x0) {
      bVar1 = extendWith((SearchState *)
                         (this->root).
                         super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         pSVar2);
      bVar4 = bVar4 | bVar1;
      _Var3._M_pi = extraout_RDX_00;
      psVar5 = &pSVar2->parent;
    }
    bVar1 = bVar4 != 0;
    bVar4 = 0;
    psVar5 = parent;
  } while (bVar1);
  sVar6.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar6.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::SearchState>)
         sVar6.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SearchState> SearchState::newChild(
    const std::shared_ptr<const SearchState> &parent, const Key &key) {
  std::shared_ptr<SearchState> searchState(new SearchState(parent, key));

  bool constraintsChanged;
  do {
    constraintsChanged = false;
    const SearchState *p = parent.get();
    while (p) {
      constraintsChanged |= searchState->extendWith(*p);
      p = p->parent.get();
    }
  } while (constraintsChanged);

  return searchState;
}